

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall dd::ProcessThreadImpl::Stop(ProcessThreadImpl *this)

{
  bool bVar1;
  pointer pPVar2;
  reference pMVar3;
  ModuleCallback *m;
  iterator __end1;
  iterator __begin1;
  ModuleList *__range1;
  AutoLock l;
  ProcessThreadImpl *this_local;
  
  l._lock = (Lock *)this;
  bVar1 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (bVar1) {
    pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::get
                       (&this->_thread);
    if (pPVar2 != (pointer)0x0) {
      AutoLock::AutoLock((AutoLock *)&__range1,&this->_lock);
      this->_stop = true;
      AutoLock::~AutoLock((AutoLock *)&__range1);
      Event::Set(&this->_wake_up);
      pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::
               operator->(&this->_thread);
      PlatformThread::Stop(pPVar2);
      this->_stop = false;
      std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::reset
                (&this->_thread,(pointer)0x0);
      __end1 = std::__cxx11::
               list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
               ::begin(&this->_modules);
      m = (ModuleCallback *)
          std::__cxx11::
          list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
          ::end(&this->_modules);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&m), bVar1) {
        pMVar3 = std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator*(&__end1);
        (*pMVar3->module->_vptr_Module[2])(pMVar3->module,0);
        std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator++(&__end1);
      }
    }
    return;
  }
  __assert_fail("_thread_checker.IsCurrent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x3c,"virtual void dd::ProcessThreadImpl::Stop()");
}

Assistant:

void ProcessThreadImpl::Stop() {
		assert(_thread_checker.IsCurrent());
		if (!_thread.get())
			return;
		{
			AutoLock l(_lock);
			_stop = true;
		}
		_wake_up.Set();
		_thread->Stop();
		_stop = false;
		_thread.reset();
		for (ModuleCallback& m : _modules)
			m.module->ProcessThreadAttached(nullptr);
	}